

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Spooky.cpp
# Opt level: O2

void __thiscall SpookyHash::Final(SpookyHash *this,uint64 *hash1,uint64 *hash2)

{
  byte bVar1;
  uint64 h8;
  uint64 h7;
  uint64 h6;
  uint64 h4;
  uint64 h3;
  uint64 h2;
  uint64 h10;
  uint64 h9;
  uint64 h5;
  uint64 h1;
  uint64 h0;
  uint64 *local_48;
  uint64 *local_40;
  uint64 h11;
  
  if (this->m_length < 0xc0) {
    Short(this,this->m_length,hash1,hash2);
    return;
  }
  h0 = this->m_state[0];
  bVar1 = this->m_remainder;
  h1 = this->m_state[1];
  h2 = this->m_state[2];
  h3 = this->m_state[3];
  h4 = this->m_state[4];
  h5 = this->m_state[5];
  h6 = this->m_state[6];
  h7 = this->m_state[7];
  h8 = this->m_state[8];
  h9 = this->m_state[9];
  h10 = this->m_state[10];
  h11 = this->m_state[0xb];
  local_48 = hash1;
  local_40 = hash2;
  if (0x5f < bVar1) {
    Mix(this->m_data,&h0,&h1,&h2,&h3,&h4,&h5,&h6,&h7,&h8,&h9,&h10,&h11);
    this = (SpookyHash *)(this->m_data + 0xc);
    bVar1 = bVar1 + 0xa0;
  }
  memset((void *)((long)this->m_data + (ulong)bVar1),0,0x60 - (ulong)bVar1);
  *(byte *)((long)this->m_data + 0x5f) = bVar1;
  Mix(this->m_data,&h0,&h1,&h2,&h3,&h4,&h5,&h6,&h7,&h8,&h9,&h10,&h11);
  End(&h0,&h1,&h2,&h3,&h4,&h5,&h6,&h7,&h8,&h9,&h10,&h11);
  *local_48 = h0;
  *local_40 = h1;
  return;
}

Assistant:

void SpookyHash::Final(uint64 *hash1, uint64 *hash2)
{
    // init the variables
    if (m_length < sc_bufSize)
    {
        Short( m_data, m_length, hash1, hash2);
        return;
    }
    
    const uint64 *data = (const uint64 *)m_data;
    uint8 remainder = m_remainder;
    
    uint64 h0 = m_state[0];
    uint64 h1 = m_state[1];
    uint64 h2 = m_state[2];
    uint64 h3 = m_state[3];
    uint64 h4 = m_state[4];
    uint64 h5 = m_state[5];
    uint64 h6 = m_state[6];
    uint64 h7 = m_state[7];
    uint64 h8 = m_state[8];
    uint64 h9 = m_state[9];
    uint64 h10 = m_state[10];
    uint64 h11 = m_state[11];

    if (remainder >= sc_blockSize)
    {
        // m_data can contain two blocks; handle any whole first block
        Mix(data, h0,h1,h2,h3,h4,h5,h6,h7,h8,h9,h10,h11);
	data += sc_numVars;
	remainder -= sc_blockSize;
    }

    // mix in the last partial block, and the length mod sc_blockSize
    memset(&((uint8 *)data)[remainder], 0, (sc_blockSize-remainder));

    ((uint8 *)data)[sc_blockSize-1] = remainder;
    Mix(data, h0,h1,h2,h3,h4,h5,h6,h7,h8,h9,h10,h11);
    
    // do some final mixing
    End(h0,h1,h2,h3,h4,h5,h6,h7,h8,h9,h10,h11);

    *hash1 = h0;
    *hash2 = h1;
}